

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertAlwaysTest.cpp
# Opt level: O1

void __thiscall
AssertAlwaysTest_assertLeShouldAbort_Test::~AssertAlwaysTest_assertLeShouldAbort_Test
          (AssertAlwaysTest_assertLeShouldAbort_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AssertAlwaysTest, assertLeShouldAbort)
{
    ::testing::FLAGS_gtest_death_test_style = "threadsafe";
    std::int32_t a = 2;
    std::int32_t b = 1;
    EXPECT_EXIT(
            CPP_ASSERT_ALWAYS_LE(a, b)
            ,::testing::KilledBySignal(SIGABRT)
            , ".*Assertion failure.*");

}